

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseMessageDefinition
          (Parser *this,DescriptorProto *message,LocationRecorder *message_location,
          FileDescriptorProto *containing_file)

{
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  char *pcVar2;
  bool bVar3;
  string *output;
  size_type sVar4;
  LocationRecorder location;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  bVar3 = Consume(this,"message");
  if (bVar3) {
    LocationRecorder::LocationRecorder(&location,message_location,1);
    LocationRecorder::RecordLegacyLocation(&location,&message->super_Message,NAME);
    output = DescriptorProto::_internal_mutable_name_abi_cxx11_(message);
    bVar3 = ConsumeIdentifier(this,output,"Expected message name.");
    if (bVar3) {
      __rhs = (message->name_).ptr_;
      if (__rhs->_M_string_length != 0) {
        pcVar2 = (__rhs->_M_dataplus)._M_p;
        if ((byte)(*pcVar2 + 0xbfU) < 0x1a) {
          sVar4 = 1;
          do {
            if (__rhs->_M_string_length == sVar4) goto LAB_00320597;
            pcVar1 = pcVar2 + sVar4;
            sVar4 = sVar4 + 1;
          } while (*pcVar1 != '_');
        }
        std::operator+(&local_68,"Message name should be in UpperCamelCase. Found: ",__rhs);
        std::operator+(&local_48,&local_68,
                       ". See https://developers.google.com/protocol-buffers/docs/style");
        AddWarning(this,&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        std::__cxx11::string::~string((string *)&local_68);
      }
LAB_00320597:
      LocationRecorder::~LocationRecorder(&location);
      bVar3 = ParseMessageBlock(this,message,message_location,containing_file);
      return bVar3;
    }
    LocationRecorder::~LocationRecorder(&location);
  }
  return false;
}

Assistant:

bool Parser::ParseMessageDefinition(
    DescriptorProto* message, const LocationRecorder& message_location,
    const FileDescriptorProto* containing_file) {
  DO(Consume("message"));
  {
    LocationRecorder location(message_location,
                              DescriptorProto::kNameFieldNumber);
    location.RecordLegacyLocation(message,
                                  DescriptorPool::ErrorCollector::NAME);
    DO(ConsumeIdentifier(message->mutable_name(), "Expected message name."));
    if (!IsUpperCamelCase(message->name())) {
      AddWarning(
          "Message name should be in UpperCamelCase. Found: " +
          message->name() +
          ". See https://developers.google.com/protocol-buffers/docs/style");
    }
  }
  DO(ParseMessageBlock(message, message_location, containing_file));
  return true;
}